

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pak.cpp
# Opt level: O1

FResourceFile * CheckPak(char *filename,FileReader *file,bool quiet)

{
  bool bVar1;
  FUncompressedFile *this;
  char head [4];
  int local_2c;
  
  if (0xb < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_2c,4);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    if (local_2c != 0x4b434150) {
      return (FResourceFile *)0x0;
    }
    this = (FUncompressedFile *)operator_new(0x28);
    FUncompressedFile::FUncompressedFile(this,filename,file);
    (this->super_FResourceFile)._vptr_FResourceFile = (_func_int **)&PTR__FUncompressedFile_00864c48
    ;
    this->Lumps = (FUncompressedLump *)0x0;
    bVar1 = FPakFile::Open((FPakFile *)this,quiet);
    if (bVar1) {
      return &this->super_FResourceFile;
    }
    (this->super_FResourceFile).Reader = (FileReader *)0x0;
    (*(this->super_FResourceFile)._vptr_FResourceFile[1])(this);
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckPak(const char *filename, FileReader *file, bool quiet)
{
	char head[4];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 4);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "PACK", 4))
		{
			FResourceFile *rf = new FPakFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}